

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_68a17e::CNNConvolveTest::RunCNNConvolveSetup(CNNConvolveTest *this,int run_times)

{
  float fVar1;
  uint uVar2;
  char cVar3;
  __suseconds_t _Var4;
  CNNConvolveTest *pCVar5;
  uint32_t uVar6;
  float *pfVar7;
  float *pfVar8;
  int in_height;
  undefined8 *puVar9;
  int iVar10;
  long lVar11;
  void *pvVar12;
  SEARCH_METHODS *pSVar13;
  int iVar14;
  int in_width;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  CNN_LAYER_CONFIG *pCVar19;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined8 *local_2c0;
  void *local_2b8;
  uint local_2b0;
  int out_width;
  int local_2a8;
  int out_height;
  aom_usec_timer timer;
  float *temp_ptr;
  CNN_LAYER_CONFIG *local_270;
  float *out_data_mod;
  float *out_data_ref;
  AssertHelper local_258;
  float relative_error;
  long local_248;
  void *local_240;
  CNNConvolveTest *local_238;
  ulong local_230;
  double local_228;
  float *local_220;
  float *output_mod [20];
  float *output_ref [20];
  float *input [20];
  
  in_height = 0x41;
  local_248 = 0;
  in_width = 0x41;
  local_2a8 = run_times;
  local_238 = this;
  do {
    out_width = 0;
    out_height = 0;
    iVar10 = in_height * in_width;
    pCVar19 = av1_intra_mode_cnn_partition_cnn_config.layer_config + local_248;
    av1_find_cnn_layer_output_size(in_width,in_height,pCVar19,&out_width,&out_height);
    local_2b0 = out_height * out_width;
    iVar15 = pCVar19->in_channels;
    local_270 = pCVar19;
    pfVar7 = (float *)aom_malloc((long)iVar10 * (long)iVar15 * 4);
    local_2c8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
    temp_ptr = pfVar7;
    testing::internal::CmpHelperNE<float*,decltype(nullptr)>
              ((internal *)&timer,"temp_ptr","nullptr",&temp_ptr,(void **)&local_2c8);
    if ((char)timer.begin.tv_sec == '\0') {
      testing::Message::Message(&local_2c8);
      if (timer.begin.tv_usec == 0) {
        pSVar13 = "";
      }
      else {
        pSVar13 = *(SEARCH_METHODS **)timer.begin.tv_usec;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                 ,0x9f2,(char *)pSVar13);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      if (local_2c8.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_2c8.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      if (timer.begin.tv_usec == 0) {
        return;
      }
      if (*(void **)timer.begin.tv_usec != (void *)(timer.begin.tv_usec + 0x10)) {
        operator_delete(*(void **)timer.begin.tv_usec);
      }
LAB_004a13ab:
      operator_delete((void *)timer.begin.tv_usec);
      return;
    }
    if (timer.begin.tv_usec != 0) {
      pvVar12 = (void *)timer.begin.tv_usec;
      if (*(void **)timer.begin.tv_usec != (void *)(timer.begin.tv_usec + 0x10)) {
        local_2b8 = (void *)timer.begin.tv_usec;
        operator_delete(*(void **)timer.begin.tv_usec);
        pvVar12 = local_2b8;
      }
      operator_delete(pvVar12);
    }
    pCVar19 = local_270;
    local_220 = pfVar7;
    if (0 < iVar15) {
      lVar16 = 0;
      pfVar7 = temp_ptr;
      do {
        input[lVar16] = pfVar7;
        iVar14 = iVar10;
        if (0 < iVar10) {
          do {
            uVar6 = testing::internal::Random::Generate(&(this->rng_).random_,0x80000000);
            pfVar7 = temp_ptr + 1;
            *temp_ptr = ((float)uVar6 + -1.0737418e+09) * 4.656613e-10;
            iVar14 = iVar14 + -1;
            temp_ptr = pfVar7;
          } while (iVar14 != 0);
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar15);
    }
    uVar2 = pCVar19->out_channels;
    iVar10 = uVar2 * local_2b0;
    out_data_ref = (float *)aom_calloc(4,(long)iVar10);
    local_2c8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
    testing::internal::CmpHelperNE<float*,decltype(nullptr)>
              ((internal *)&timer,"out_data_ref","nullptr",&out_data_ref,(void **)&local_2c8);
    _Var4 = timer.begin.tv_usec;
    if ((char)timer.begin.tv_sec == '\0') {
      testing::Message::Message(&local_2c8);
      if (timer.begin.tv_usec == 0) {
        pSVar13 = "";
      }
      else {
        pSVar13 = *(SEARCH_METHODS **)timer.begin.tv_usec;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                 ,0x9fd,(char *)pSVar13);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      if (local_2c8.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_2c8.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      if (timer.begin.tv_usec == 0) {
        return;
      }
      if (*(void **)timer.begin.tv_usec != (void *)(timer.begin.tv_usec + 0x10)) {
        operator_delete(*(void **)timer.begin.tv_usec);
      }
      goto LAB_004a13ab;
    }
    if (timer.begin.tv_usec != 0) {
      if (*(void **)timer.begin.tv_usec != (void *)(timer.begin.tv_usec + 0x10)) {
        operator_delete(*(void **)timer.begin.tv_usec);
      }
      operator_delete((void *)_Var4);
    }
    out_data_mod = (float *)aom_calloc(4,(long)iVar10);
    local_2c8.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )0x0;
    testing::internal::CmpHelperNE<float*,decltype(nullptr)>
              ((internal *)&timer,"out_data_mod","nullptr",&out_data_mod,(void **)&local_2c8);
    _Var4 = timer.begin.tv_usec;
    if ((char)timer.begin.tv_sec == '\0') {
      testing::Message::Message(&local_2c8);
      if (timer.begin.tv_usec == 0) {
        pSVar13 = "";
      }
      else {
        pSVar13 = *(SEARCH_METHODS **)timer.begin.tv_usec;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                 ,0xa01,(char *)pSVar13);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      if (local_2c8.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
          (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
           )0x0) {
        (**(code **)(*(long *)local_2c8.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
      if (timer.begin.tv_usec == 0) {
        return;
      }
      if (*(void **)timer.begin.tv_usec != (void *)(timer.begin.tv_usec + 0x10)) {
        operator_delete(*(void **)timer.begin.tv_usec);
      }
      goto LAB_004a13ab;
    }
    if (timer.begin.tv_usec != 0) {
      if (*(void **)timer.begin.tv_usec != (void *)(timer.begin.tv_usec + 0x10)) {
        operator_delete(*(void **)timer.begin.tv_usec);
      }
      operator_delete((void *)_Var4);
    }
    if (0 < (int)uVar2) {
      pvVar12 = (void *)0x0;
      pfVar7 = out_data_mod;
      pfVar8 = out_data_ref;
      do {
        output_ref[(long)pvVar12] = pfVar8;
        output_mod[(long)pvVar12] = pfVar7;
        pvVar12 = (void *)((long)pvVar12 + 1);
        pfVar7 = pfVar7 + (int)local_2b0;
        pfVar8 = pfVar8 + (int)local_2b0;
      } while ((void *)(ulong)uVar2 != pvVar12);
    }
    local_230 = (ulong)(uint)out_width;
    local_2b8 = (void *)(ulong)(iVar15 * uVar2);
    local_240 = (void *)(ulong)uVar2;
    gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
    pCVar5 = local_238;
    pCVar19 = local_270;
    iVar15 = local_2a8;
    if (0 < local_2a8) {
      do {
        (*(pCVar5->params_).ref_func)
                  (input,in_height,in_width,in_height,pCVar19,output_ref,(int)local_230,0,
                   (int)local_2b8,1);
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
    }
    gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
    lVar17 = timer.end.tv_sec - CONCAT71(timer.begin.tv_sec._1_7_,(char)timer.begin.tv_sec);
    lVar11 = timer.end.tv_usec - timer.begin.tv_usec;
    lVar16 = lVar11 + 1000000;
    if (-1 < lVar11) {
      lVar16 = lVar11;
    }
    gettimeofday((timeval *)&timer,(__timezone_ptr_t)0x0);
    uVar18 = local_230;
    pCVar19 = local_270;
    if (local_2a8 < 1) {
      gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
LAB_004a0e3e:
      if (0 < (int)local_240) {
        uVar18 = (ulong)local_2b0;
        local_2b8 = (void *)0x0;
        do {
          if (0 < (int)local_2b0) {
            pfVar7 = output_ref[(long)local_2b8];
            pfVar8 = output_mod[(long)local_2b8];
            lVar16 = 0;
            do {
              fVar1 = *pfVar7;
              if (0.001 <= fVar1) {
                relative_error = ABS((fVar1 - *pfVar8) / fVar1);
                local_2d0.data_._0_4_ = 0x3a83126f;
                testing::internal::CmpHelperLE<float,float>
                          ((internal *)&local_2c8,"relative_error","1E-3f",&relative_error,
                           (float *)&local_2d0);
                puVar9 = local_2c0;
                if (local_2c8.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._0_1_ == (internal)0x0) {
                  testing::Message::Message((Message *)&local_2d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             (CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),
                             " channel ",9);
                  std::ostream::operator<<
                            ((void *)(CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),
                             (int)local_2b8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             (CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),
                             " pixel ",7);
                  std::ostream::operator<<
                            ((void *)(CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),
                             -(int)lVar16);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             (CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),": ",2);
                  std::ostream::_M_insert<double>((double)*pfVar7);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             (CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),"/",1);
                  std::ostream::_M_insert<double>((double)*pfVar8);
                  cVar3 = (char)local_2d0.data_._0_4_ + '\x10';
                  std::ios::widen((char)*(undefined8 *)
                                         (*(long *)(CONCAT44(local_2d0.data_._4_4_,
                                                             local_2d0.data_._0_4_) + 0x10) + -0x18)
                                  + cVar3);
                  std::ostream::put(cVar3);
                  std::ostream::flush();
                  pSVar13 = "";
                  if (local_2c0 != (undefined8 *)0x0) {
                    pSVar13 = (SEARCH_METHODS *)*local_2c0;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_258,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                             ,0xa44,(char *)pSVar13);
                  testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_2d0);
                  testing::internal::AssertHelper::~AssertHelper(&local_258);
                  if ((long *)CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) != (long *)0x0)
                  {
                    (**(code **)(*(long *)CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 8)
                    )();
                  }
                  puVar9 = local_2c0;
                  if (local_2c0 != (undefined8 *)0x0) {
                    if ((undefined8 *)*local_2c0 != local_2c0 + 2) {
                      operator_delete((undefined8 *)*local_2c0);
                    }
                    goto LAB_004a11c5;
                  }
                  goto LAB_004a11cd;
                }
                if (local_2c0 != (undefined8 *)0x0) {
                  if ((undefined8 *)*local_2c0 != local_2c0 + 2) {
                    operator_delete((undefined8 *)*local_2c0);
                  }
                  goto LAB_004a0f50;
                }
              }
              else {
                local_2d0.data_._0_4_ = 0x3a83126f;
                testing::internal::CmpHelperLE<float,float>
                          ((internal *)&local_2c8,"buf_ref[i]","1E-3f",pfVar7,(float *)&local_2d0);
                puVar9 = local_2c0;
                if (local_2c8.ss_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._0_1_ == (internal)0x0) {
                  testing::Message::Message((Message *)&local_2d0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             (CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),
                             "Reference output was near-zero, test output was not (",0x35);
                  std::ostream::_M_insert<double>((double)*pfVar8);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)
                             (CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 0x10),")",1);
                  pSVar13 = "";
                  if (local_2c0 != (undefined8 *)0x0) {
                    pSVar13 = (SEARCH_METHODS *)*local_2c0;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_258,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/cnn_test.cc"
                             ,0xa3e,(char *)pSVar13);
                  testing::internal::AssertHelper::operator=(&local_258,(Message *)&local_2d0);
                  testing::internal::AssertHelper::~AssertHelper(&local_258);
                  if ((long *)CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) != (long *)0x0)
                  {
                    (**(code **)(*(long *)CONCAT44(local_2d0.data_._4_4_,local_2d0.data_._0_4_) + 8)
                    )();
                  }
                  puVar9 = local_2c0;
                  if (local_2c0 != (undefined8 *)0x0) {
                    if ((undefined8 *)*local_2c0 != local_2c0 + 2) {
                      operator_delete((undefined8 *)*local_2c0);
                    }
LAB_004a11c5:
                    operator_delete(puVar9);
                  }
                  goto LAB_004a11cd;
                }
                if (local_2c0 != (undefined8 *)0x0) {
                  if ((undefined8 *)*local_2c0 != local_2c0 + 2) {
                    operator_delete((undefined8 *)*local_2c0);
                  }
LAB_004a0f50:
                  operator_delete(puVar9);
                }
              }
              pfVar8 = pfVar8 + 1;
              lVar16 = lVar16 + -1;
              pfVar7 = pfVar7 + 1;
            } while (-lVar16 != uVar18);
          }
          local_2b8 = (void *)((long)local_2b8 + 1);
        } while (local_2b8 != local_240);
      }
    }
    else {
      local_228 = (double)((lVar17 + (lVar11 >> 0x3f)) * 1000000 + lVar16);
      iVar15 = local_2a8;
      do {
        (*(local_238->params_).tst_func)
                  (input,in_height,in_width,in_height,pCVar19,output_mod,(int)uVar18,0,
                   (int)local_2b8,1);
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
      gettimeofday((timeval *)&timer.end,(__timezone_ptr_t)0x0);
      if (local_2a8 == 1) goto LAB_004a0e3e;
      lVar11 = timer.end.tv_usec - timer.begin.tv_usec;
      lVar16 = lVar11 + 1000000;
      if (-1 < lVar11) {
        lVar16 = lVar11;
      }
      local_2b8 = (void *)(double)(lVar16 + ((lVar11 >> 0x3f) +
                                            (timer.end.tv_sec -
                                            CONCAT71(timer.begin.tv_sec._1_7_,
                                                     (char)timer.begin.tv_sec))) * 1000000);
      printf("layer : %d \n",local_248);
      printf("%7.2f/%7.2fns (%3.2f)\n",local_228,local_2b8,local_228 / (double)local_2b8);
    }
LAB_004a11cd:
    in_width = out_height;
    in_height = out_width;
    aom_free(local_220);
    aom_free(out_data_ref);
    aom_free(out_data_mod);
    local_248 = local_248 + 1;
    if (local_248 == 5) {
      return;
    }
  } while( true );
}

Assistant:

void RunCNNConvolveSetup(int run_times) {
    int in_width = 65;
    int in_height = 65;

    const CNN_CONFIG *cnn_config = &av1_intra_mode_cnn_partition_cnn_config;

    for (int layer = 0; layer < cnn_config->num_layers; ++layer) {
      int out_width = 0, out_height = 0;
      int in_size = in_width * in_height;
      // Get current layer output width and height.
      av1_find_cnn_layer_output_size(in_height, in_width,
                                     &cnn_config->layer_config[layer],
                                     &out_width, &out_height);

      int out_size = out_width * out_height;
      float *input[20], *output_ref[20], *output_mod[20];

      float *input_data =
          (float *)aom_malloc(sizeof(*input_data) * in_size *
                              cnn_config->layer_config[layer].in_channels);
      float *temp_ptr = input_data;
      ASSERT_NE(temp_ptr, nullptr);
      for (int i = 0; i < cnn_config->layer_config[layer].in_channels; ++i) {
        input[i] = temp_ptr;
        for (int j = 0; j < in_size; j++) {
          *(temp_ptr++) = ((float)rng_.Rand31() - (1 << 30)) / (1u << 31);
        }
      }

      float *out_data_ref = (float *)aom_calloc(
          sizeof(*out_data_ref),
          out_size * cnn_config->layer_config[layer].out_channels);
      ASSERT_NE(out_data_ref, nullptr);
      float *out_data_mod = (float *)aom_calloc(
          sizeof(*out_data_mod),
          out_size * cnn_config->layer_config[layer].out_channels);
      ASSERT_NE(out_data_mod, nullptr);
      float *temp_ptr1 = out_data_ref;
      float *temp_ptr2 = out_data_mod;
      for (int i = 0; i < cnn_config->layer_config[layer].out_channels; ++i) {
        output_ref[i] = temp_ptr1;
        output_mod[i] = temp_ptr2;
        temp_ptr1 += out_size;
        temp_ptr2 += out_size;
      }

      RunCNNConvolveTest(input, in_width, in_height, out_size,
                         &cnn_config->layer_config[layer], 0, 1, run_times,
                         layer, output_ref, output_mod, out_width);

      // Set current layer output width and height as next layer input width and
      // height.
      in_width = out_width;
      in_height = out_height;

      aom_free(input_data);
      aom_free(out_data_ref);
      aom_free(out_data_mod);
    }
  }